

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall
QWidgetPrivate::drawWidget
          (QWidgetPrivate *this,QPaintDevice *pdev,QRegion *rgn,QPoint *offset,DrawWidgetFlags flags
          ,QPainter *sharedPainter,QWidgetRepaintManager *repaintManager)

{
  QWidget *widget;
  QGraphicsEffectSourcePrivate *this_00;
  QWidgetData *pQVar1;
  qreal qVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  QTextStream *this_01;
  QRegion QVar10;
  char cVar11;
  bool bVar12;
  bool bVar13;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> QVar14;
  int iVar15;
  long *plVar16;
  QPalette *pQVar17;
  QBrush *pQVar18;
  QPoint QVar19;
  QPaintEngine *pQVar20;
  QTransform *this_02;
  undefined8 *puVar21;
  long *plVar22;
  byte bVar23;
  uint uVar24;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> flags_00;
  long lVar25;
  undefined8 extraout_RDX;
  undefined8 *puVar26;
  undefined8 *puVar27;
  QWidgetPrivate *pQVar28;
  long in_FS_OFFSET;
  QRect QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QPoint local_e0;
  QPoint local_d8;
  QBrush bg;
  undefined1 local_c8 [8];
  QPainter p;
  QPoint local_b8;
  QRegion toBePainted;
  QDebug local_a8;
  QDebug local_a0;
  undefined1 local_98 [32];
  QPainter p_2;
  undefined4 uStack_70;
  Representation RStack_6c;
  Representation RStack_68;
  Representation local_64;
  char *local_60;
  QPainter *pQStack_58;
  QWidgetRepaintManager *local_50;
  QPointF *pQStack_48;
  long local_38;
  
  bVar23 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar11 = QRegion::isEmpty();
  if (cVar11 != '\0') goto LAB_002fb96b;
  widget = *(QWidget **)&this->field_0x8;
  QtPrivateLogging::lcWidgetPainting();
  if (((byte)QtPrivateLogging::lcWidgetPainting::category.field_2.bools.enabledInfo._q_value._M_base
             ._M_i & 1) != 0) {
    _p_2 = 2;
    uStack_70 = 0;
    RStack_6c.m_i = 0;
    RStack_68.m_i = 0;
    local_64.m_i = 0;
    local_60 = QtPrivateLogging::lcWidgetPainting::category.name;
    QMessageLogger::info();
    QVar19 = local_e0;
    QVar30.m_data = (storage_type *)0x7;
    QVar30.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar30);
    QTextStream::operator<<((QTextStream *)QVar19,(QString *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_e0 + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_e0,' ');
    }
    local_d8 = local_e0;
    *(int *)((long)local_e0 + 0x28) = *(int *)((long)local_e0 + 0x28) + 1;
    ::operator<<((Stream *)&bg,(QRegion *)&local_d8);
    this_01 = _bg;
    QVar31.m_data = (storage_type *)0x2;
    QVar31.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar31);
    QTextStream::operator<<(this_01,(QString *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if (_bg[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(_bg,' ');
    }
    local_c8 = (undefined1  [8])_bg;
    *(int *)(_bg + 0x28) = *(int *)(_bg + 0x28) + 1;
    ::operator<<((Stream *)&p,(QWidget *)local_c8);
    QVar19 = _p;
    QVar32.m_data = (storage_type *)0x2;
    QVar32.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar32);
    QTextStream::operator<<((QTextStream *)QVar19,(QString *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if (*(QTextStream *)((long)_p + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)_p,' ');
    }
    local_b8 = _p;
    *(int *)((long)_p + 0x28) = *(int *)((long)_p + 0x28) + 1;
    ::operator<<((Stream *)&toBePainted,&local_b8);
    QVar10 = toBePainted;
    QVar33.m_data = (storage_type *)0x11;
    QVar33.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar33);
    QTextStream::operator<<((QTextStream *)QVar10.d,(QString *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if (toBePainted.d[0x30] == (QRegionData)0x1) {
      QTextStream::operator<<((QTextStream *)toBePainted.d,' ');
    }
    QTextStream::operator<<((QTextStream *)toBePainted.d,pdev);
    if (toBePainted.d[0x30] == (QRegionData)0x1) {
      QTextStream::operator<<((QTextStream *)toBePainted.d,' ');
    }
    QVar10.d = toBePainted.d;
    QVar34.m_data = (storage_type *)0x4;
    QVar34.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar34);
    QTextStream::operator<<((QTextStream *)QVar10.d,(QString *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if (toBePainted.d[0x30] == (QRegionData)0x1) {
      QTextStream::operator<<((QTextStream *)toBePainted.d,' ');
    }
    *(int *)(toBePainted.d + 0x28) = *(int *)(toBePainted.d + 0x28) + 1;
    qt_QMetaEnum_flagDebugOperator
              (&local_a0,(ulonglong)&local_a8,
               (QMetaObject *)
               (ulong)(uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                            super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i,
               (char *)&staticMetaObject);
    QDebug::~QDebug(&local_a0);
    QDebug::~QDebug(&local_a8);
    QDebug::~QDebug((QDebug *)&toBePainted);
    QDebug::~QDebug((QDebug *)&local_b8);
    QDebug::~QDebug((QDebug *)&p);
    QDebug::~QDebug((QDebug *)local_c8);
    QDebug::~QDebug((QDebug *)&bg);
    QDebug::~QDebug((QDebug *)&local_d8);
    QDebug::~QDebug((QDebug *)&local_e0);
  }
  bVar12 = shouldPaintOnScreen(this);
  if (this->graphicsEffect == (QGraphicsEffect *)0x0) {
LAB_002fb378:
    toBePainted.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&toBePainted,rgn);
    if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 9) == 1) {
      QVar29 = clipRect(this);
      _p_2 = QVar29.x1.m_i;
      uStack_70 = QVar29.x2.m_i;
      RStack_6c = QVar29.y2.m_i;
      QRegion::operator&=(&toBePainted,(QRect *)&p_2);
    }
    if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 0x10) == 0) {
      pQVar1 = widget->data;
      uStack_70 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
      RStack_6c.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
      _p_2 = 0;
      subtractOpaqueChildren(this,&toBePainted,(QRect *)&p_2);
    }
    cVar11 = QRegion::isEmpty();
    if (cVar11 == '\0') {
      if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                 super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 2) == 0 && bVar12) {
        if (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
          plVar16 = (long *)(**(code **)(*(long *)pdev + 0x18))();
          if (plVar16 != (long *)0x0) {
            _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter(&p,pdev);
            QPainter::setClipRegion((QRegion *)&p,(ClipOperation)&toBePainted);
            _bg = (QTextStream *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar17 = QWidget::palette(widget);
            pQVar18 = (QBrush *)QPalette::brush((ColorGroup)pQVar17,Dark);
            QBrush::QBrush(&bg,pQVar18);
            if (*(int *)(_bg + 4) == 0x18) {
              pQVar1 = widget->data;
              auVar7._4_4_ = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
              auVar7._0_4_ = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
              auVar7._8_8_ = 0;
              local_98._0_16_ = auVar7 << 0x40;
              QBrush::texture();
              local_e0.xp.m_i = 0;
              local_e0.yp.m_i = 0;
              QPainter::drawTiledPixmap(&p,(QRect *)local_98,(QPixmap *)&p_2,&local_e0);
              QPixmap::~QPixmap((QPixmap *)&p_2);
            }
            else {
              pQVar1 = widget->data;
              uStack_70 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
              RStack_6c.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
              _p_2 = 0;
              QPainter::fillRect((QRect *)&p,(QBrush *)&p_2);
            }
            if ((*(byte *)((long)plVar16 + 0x14) & 2) != 0) {
              (**(code **)(*plVar16 + 8))();
            }
            QBrush::~QBrush(&bg);
            QPainter::~QPainter(&p);
          }
        }
      }
      else {
        lVar25 = *(long *)&widget->field_0x8;
        uVar24 = *(uint *)(lVar25 + 0x240);
        if ((uVar24 >> 0x1e & 1) != 0) {
          _p_2 = 2;
          uStack_70 = 0;
          RStack_6c.m_i = 0;
          RStack_68.m_i = 0;
          local_64.m_i = 0;
          local_60 = "default";
          QMessageLogger::warning((char *)&p_2,"QWidget::repaint: Recursive repaint detected");
          lVar25 = *(long *)&widget->field_0x8;
          uVar24 = *(uint *)(lVar25 + 0x240);
        }
        if ((uVar24 >> 0x1e & 1) == 0) {
          *(uint *)(lVar25 + 0x240) = uVar24 | 0x40000000;
        }
        plVar16 = (long *)(**(code **)(*(long *)pdev + 0x18))();
        if (plVar16 != (long *)0x0) {
          QVar19.yp.m_i = -(offset->yp).m_i;
          QVar19.xp.m_i = -(offset->xp).m_i;
          this->redirectDev = pdev;
          this->redirectOffset = QVar19;
          if (sharedPainter == (QPainter *)0x0) {
            pQVar1 = widget->data;
            lVar25 = plVar16[3];
            iVar15 = (pQVar1->crect).y1.m_i;
            iVar4 = (pQVar1->crect).x2.m_i;
            iVar5 = (pQVar1->crect).y2.m_i;
            *(int *)(lVar25 + 0x28) = (pQVar1->crect).x1.m_i;
            *(int *)(lVar25 + 0x2c) = iVar15;
            *(int *)(lVar25 + 0x30) = iVar4;
            *(int *)(lVar25 + 0x34) = iVar5;
          }
          else {
            pQVar20 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
            pQVar28 = (QWidgetPrivate *)pdev;
            qVar2 = (qreal)QPaintDevice::devicePixelRatio();
            setSystemClip(pQVar28,pQVar20,qVar2,&toBePainted);
          }
          if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                     super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 1) == 0) {
            lVar25 = *(long *)(*(long *)&widget->field_0x8 + 0x78);
            if (lVar25 == 0) {
              bVar23 = 0;
            }
            else {
              bVar23 = (*(byte *)(lVar25 + 0x7c) & 0x10) >> 4;
            }
            if ((bVar23 != 0 || bVar12) ||
               ((*(byte *)(*(long *)&widget->field_0x8 + 0x247) & 0x20) != 0)) goto LAB_002fba13;
          }
          else {
LAB_002fba13:
            if ((widget->data->widget_attributes & 0x210) == 0) {
              (**(code **)(*(long *)this + 0x60))(this);
              _p_2 = -0x55555556;
              QPainter::QPainter(&p_2,&widget->super_QPaintDevice);
              QPainter::setRenderHint((RenderHint)&p_2,true);
              QVar14.i = (uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 0xfffffefe |
                         1;
              flags_00.i = 0;
              if (bVar12) {
                flags_00.i = QVar14.i;
              }
              if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                         super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 1) != 0) {
                flags_00.i = QVar14.i;
              }
              paintBackground(this,&p_2,&toBePainted,(DrawWidgetFlags)flags_00.i);
              (**(code **)(*(long *)this + 0x68))(this);
              QPainter::~QPainter(&p_2);
            }
          }
          if (sharedPainter == (QPainter *)0x0) {
            pQVar20 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
            qVar2 = (qreal)QPaintDevice::devicePixelRatio();
            pQVar28 = (QWidgetPrivate *)&p_2;
            QRegion::translated((int)(QWidgetPrivate *)&p_2,(int)&toBePainted);
            setSystemClip(pQVar28,pQVar20,qVar2,(QRegion *)&p_2);
            QRegion::~QRegion((QRegion *)&p_2);
          }
          if (((!bVar12 &&
                ((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                       super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 1) == 0) &&
              ((this->field_0x252 & 2) == 0)) &&
             ((*(byte *)(*(long *)&widget->field_0x8 + 0x246) & 4) != 0)) {
            (**(code **)(*(long *)this + 0x60))(this);
            _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter(&p,&widget->super_QPaintDevice);
            pQVar17 = QWidget::palette(widget);
            plVar22 = (long *)QPalette::brush((ColorGroup)pQVar17,Dark);
            uVar6 = *(undefined8 *)(*plVar22 + 0x10);
            _p_2 = (int)*(undefined8 *)(*plVar22 + 8);
            uStack_70 = (undefined4)uVar6;
            RStack_6c.m_i = (int)((ulong)uVar6 >> 0x20);
            QColor::setAlphaF(0.6);
            local_98._0_16_ = QRegion::boundingRect();
            QPainter::fillRect((QRect *)&p,(QColor *)local_98);
            (**(code **)(*(long *)this + 0x68))(this);
            QPainter::~QPainter(&p);
          }
        }
        if ((this->field_0x253 & 1) == 0) {
LAB_002fbbe2:
          sendPaintEvent(this,&toBePainted);
        }
        else {
          (**(code **)(*(long *)this + 0x60))(this);
          if ((repaintManager == (QWidgetRepaintManager *)0x0) ||
             ((*(uint *)(*(long *)&widget->field_0x8 + 0x24c) & 1) != 0)) {
            if (repaintManager != (QWidgetRepaintManager *)0x0) goto LAB_002fbcb0;
            RStack_68.m_i = -0x55555556;
            local_64.m_i = -0x55555556;
            _p_2 = -0x55555556;
            uStack_70 = -0x55555556;
            RStack_6c.m_i = -0x55555556;
            (**(code **)(*(long *)this + 0x58))(&p_2,this);
            iVar15 = QImage::format();
            if (iVar15 == 4) {
              QImage::reinterpretAsFormat((Format)&p_2);
            }
            _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter(&p,&widget->super_QPaintDevice);
            pQVar1 = widget->data;
            auVar9._4_4_ = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
            auVar9._0_4_ = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
            auVar9._8_8_ = 0;
            local_98._0_16_ = auVar9 << 0x40;
            QPainter::drawImage(&p,(QRect *)local_98,(QImage *)&p_2);
            QPainter::~QPainter(&p);
            QImage::~QImage((QImage *)&p_2);
            bVar12 = true;
          }
          else {
            _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter(&p,&widget->super_QPaintDevice);
            QPainter::setCompositionMode((CompositionMode)(QRect *)&p);
            pQVar1 = widget->data;
            auVar8._4_4_ = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
            auVar8._0_4_ = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
            auVar8._8_8_ = 0;
            local_98._0_16_ = auVar8 << 0x40;
            QColor::QColor((QColor *)&p_2,transparent);
            QPainter::fillRect((QRect *)&p,(QColor *)local_98);
            QPainter::~QPainter(&p);
LAB_002fbcb0:
            bVar12 = false;
          }
          (**(code **)(*(long *)this + 0x68))(this);
          if (((*(uint *)&this->field_0x250 >> 0x1b & 1) != 0) &&
             (*(uint *)&this->field_0x250 = *(uint *)&this->field_0x250 & 0xf7ffffff, !bVar12))
          goto LAB_002fbbe2;
        }
        if (repaintManager != (QWidgetRepaintManager *)0x0) {
          QWidgetRepaintManager::markNeedsFlush
                    ((QWidgetRepaintManager *)repaintManager,widget,&toBePainted,offset);
        }
        if (plVar16 != (long *)0x0) {
          this->redirectDev = (QPaintDevice *)0x0;
          lVar25 = plVar16[3];
          if (sharedPainter == (QPainter *)0x0) {
            *(undefined4 *)(lVar25 + 0x28) = 0;
            *(undefined4 *)(lVar25 + 0x2c) = 0;
            *(undefined4 *)(lVar25 + 0x30) = 0xffffffff;
            *(undefined4 *)(lVar25 + 0x34) = 0xffffffff;
          }
          else {
            *(undefined8 *)(lVar25 + 0x90) = 0;
          }
          pQVar20 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))();
          pQVar28 = (QWidgetPrivate *)&p_2;
          QRegion::QRegion((QRegion *)&p_2);
          setSystemClip(pQVar28,pQVar20,1.0,(QRegion *)&p_2);
          QRegion::~QRegion((QRegion *)&p_2);
        }
        uVar24 = *(uint *)(*(long *)&widget->field_0x8 + 0x240);
        if ((uVar24 >> 0x1e & 1) != 0) {
          *(uint *)(*(long *)&widget->field_0x8 + 0x240) = uVar24 & 0xbfffffff;
        }
        if (*(short *)&widget->field_0x18 != 0) {
          drawWidget();
        }
        if ((plVar16 != (long *)0x0) && ((*(byte *)((long)plVar16 + 0x14) & 2) != 0)) {
          (**(code **)(*plVar16 + 8))(plVar16);
        }
      }
    }
    if ((((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 4) != 0) &&
       (*(long *)&this->field_0x28 != 0)) {
      paintSiblingsRecursive
                (this,pdev,(QObjectList *)&this->field_0x18,(int)*(long *)&this->field_0x28 + -1,rgn
                 ,offset,(DrawWidgetFlags)
                         ((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                                super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 0xfffffefe),
                 sharedPainter,repaintManager);
    }
  }
  else {
    bVar13 = QGraphicsEffect::isEnabled(this->graphicsEffect);
    if ((!bVar13) ||
       (this_00 = *(QGraphicsEffectSourcePrivate **)
                   (*(long *)(*(long *)&this->graphicsEffect->field_0x8 + 0x78) + 8),
       *(long *)&this_00[1].field_0x8 != 0)) goto LAB_002fb378;
    toBePainted.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i >> 8 & 1) == 0) {
      QRegion::QRegion(&toBePainted,rgn);
    }
    else {
      _p_2 = QRegion::boundingRect();
      uStack_70 = (undefined4)extraout_RDX;
      RStack_6c.m_i = (int)((ulong)extraout_RDX >> 0x20);
      QRegion::QRegion(&toBePainted,(QRect *)&p_2,Rectangle);
    }
    local_50 = (QWidgetRepaintManager *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_48 = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_58 = (QPainter *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_70 = -0x55555556;
    RStack_6c.m_i = -0x55555556;
    RStack_68.m_i = 0xaaaaaaaa;
    local_64.m_i = 0xaaaaaaaa;
    _p_2 = (int)pdev;
    QRegion::QRegion((QRegion *)&stack0xffffffffffffff90,&toBePainted);
    RStack_68 = (*offset).xp;
    local_64 = (*offset).yp;
    local_60 = (char *)CONCAT44(local_60._4_4_,
                                flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                                super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i);
    local_50 = repaintManager;
    pQStack_48 = (QPointF *)0x0;
    *(QPainter **)&this_00[1].field_0x8 = &p_2;
    pQStack_58 = sharedPainter;
    if (sharedPainter == (QPainter *)0x0) {
      pQVar20 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
      qVar2 = (qreal)QPaintDevice::devicePixelRatio();
      pQVar28 = (QWidgetPrivate *)local_98;
      QRegion::translated((int)(QWidgetPrivate *)local_98,(int)&toBePainted);
      setSystemClip(pQVar28,pQVar20,qVar2,(QRegion *)local_98);
      QRegion::~QRegion((QRegion *)local_98);
      _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter(&p,pdev);
      dVar3 = (double)(*offset).yp.m_i;
      local_98._8_4_ = SUB84(dVar3,0);
      local_98._0_8_ = (double)(*offset).xp.m_i;
      local_98._12_4_ = (int)((ulong)dVar3 >> 0x20);
      QPainter::translate((QPointF *)&p);
      pQStack_48 = (QPointF *)&p;
      (**(code **)(*(long *)this->graphicsEffect + 0x68))(this->graphicsEffect,(QPointF *)&p);
      pQVar20 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
      pQVar28 = (QWidgetPrivate *)local_98;
      QRegion::QRegion((QRegion *)local_98);
      setSystemClip(pQVar28,pQVar20,1.0,(QRegion *)local_98);
      QRegion::~QRegion((QRegion *)local_98);
      QPainter::~QPainter(&p);
    }
    else {
      pQStack_48 = (QPointF *)sharedPainter;
      this_02 = (QTransform *)QPainter::worldTransform();
      cVar11 = QTransform::operator!=(this_02,(QTransform *)&this_00[1].field_0x10);
      if (cVar11 != '\0') {
        QGraphicsEffectSourcePrivate::invalidateCache(this_00,SourceChanged);
        puVar21 = (undefined8 *)QPainter::worldTransform();
        puVar26 = puVar21;
        puVar27 = (undefined8 *)&this_00[1].field_0x10;
        for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
          *puVar27 = *puVar26;
          puVar26 = puVar26 + (ulong)bVar23 * -2 + 1;
          puVar27 = puVar27 + (ulong)bVar23 * -2 + 1;
        }
        *(undefined2 *)&this_00[1].field_0x58 = *(undefined2 *)(puVar21 + 9);
      }
      QPainter::save();
      dVar3 = (double)(*offset).yp.m_i;
      local_98._8_4_ = SUB84(dVar3,0);
      local_98._0_8_ = (double)(*offset).xp.m_i;
      local_98._12_4_ = (int)((ulong)dVar3 >> 0x20);
      QPainter::translate((QPointF *)sharedPainter);
      pQVar20 = (QPaintEngine *)QPainter::paintEngine();
      QPainter::device();
      qVar2 = (qreal)QPaintDevice::devicePixelRatio();
      pQVar28 = (QWidgetPrivate *)local_98;
      QRegion::translated((int)(QWidgetPrivate *)local_98,(int)&toBePainted);
      setSystemClip(pQVar28,pQVar20,qVar2,(QRegion *)local_98);
      QRegion::~QRegion((QRegion *)local_98);
      (**(code **)(*(long *)this->graphicsEffect + 0x68))(this->graphicsEffect,sharedPainter);
      pQVar20 = (QPaintEngine *)QPainter::paintEngine();
      pQVar28 = (QWidgetPrivate *)local_98;
      QRegion::QRegion((QRegion *)local_98);
      setSystemClip(pQVar28,pQVar20,1.0,(QRegion *)local_98);
      QRegion::~QRegion((QRegion *)local_98);
      QPainter::restore();
    }
    *(undefined8 *)&this_00[1].field_0x8 = 0;
    if (repaintManager != (QWidgetRepaintManager *)0x0) {
      QWidgetRepaintManager::markNeedsFlush
                ((QWidgetRepaintManager *)repaintManager,widget,&toBePainted,offset);
    }
    QRegion::~QRegion((QRegion *)&stack0xffffffffffffff90);
  }
  QRegion::~QRegion(&toBePainted);
LAB_002fb96b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::drawWidget(QPaintDevice *pdev, const QRegion &rgn, const QPoint &offset, DrawWidgetFlags flags,
                                QPainter *sharedPainter, QWidgetRepaintManager *repaintManager)
{
    if (rgn.isEmpty())
        return;

    Q_Q(QWidget);

    qCInfo(lcWidgetPainting) << "Drawing" << rgn << "of" << q << "at" << offset
        << "into paint device" << pdev << "with" << flags;

    const bool asRoot = flags & DrawAsRoot;
    bool onScreen = shouldPaintOnScreen();

#if QT_CONFIG(graphicseffect)
    if (graphicsEffect && graphicsEffect->isEnabled()) {
        QGraphicsEffectSource *source = graphicsEffect->d_func()->source;
        QWidgetEffectSourcePrivate *sourced = static_cast<QWidgetEffectSourcePrivate *>
                                                         (source->d_func());
        if (!sourced->context) {
            const QRegion effectRgn((flags & UseEffectRegionBounds) ? rgn.boundingRect() : rgn);
            QWidgetPaintContext context(pdev, effectRgn, offset, flags, sharedPainter, repaintManager);
            sourced->context = &context;
            if (!sharedPainter) {
                setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), effectRgn.translated(offset));
                QPainter p(pdev);
                p.translate(offset);
                context.painter = &p;
                graphicsEffect->draw(&p);
                setSystemClip(pdev->paintEngine(), 1, QRegion());
            } else {
                context.painter = sharedPainter;
                if (sharedPainter->worldTransform() != sourced->lastEffectTransform) {
                    sourced->invalidateCache();
                    sourced->lastEffectTransform = sharedPainter->worldTransform();
                }
                sharedPainter->save();
                sharedPainter->translate(offset);
                setSystemClip(sharedPainter->paintEngine(), sharedPainter->device()->devicePixelRatio(), effectRgn.translated(offset));
                graphicsEffect->draw(sharedPainter);
                setSystemClip(sharedPainter->paintEngine(), 1, QRegion());
                sharedPainter->restore();
            }
            sourced->context = nullptr;

            if (repaintManager)
                repaintManager->markNeedsFlush(q, effectRgn, offset);

            return;
        }
    }
#endif // QT_CONFIG(graphicseffect)
    flags = flags & ~UseEffectRegionBounds;

    const bool alsoOnScreen = flags & DrawPaintOnScreen;
    const bool recursive = flags & DrawRecursive;
    const bool alsoInvisible = flags & DrawInvisible;

    Q_ASSERT(sharedPainter ? sharedPainter->isActive() : true);

    QRegion toBePainted(rgn);
    if (asRoot && !alsoInvisible)
        toBePainted &= clipRect(); //(rgn & visibleRegion());
    if (!(flags & DontSubtractOpaqueChildren))
        subtractOpaqueChildren(toBePainted, q->rect());

    if (!toBePainted.isEmpty()) {
        if (!onScreen || alsoOnScreen) {
            //update the "in paint event" flag
            if (Q_UNLIKELY(q->testAttribute(Qt::WA_WState_InPaintEvent)))
                qWarning("QWidget::repaint: Recursive repaint detected");
            q->setAttribute(Qt::WA_WState_InPaintEvent);

            //clip away the new area
            QPaintEngine *paintEngine = pdev->paintEngine();
            if (paintEngine) {
                setRedirected(pdev, -offset);

                if (sharedPainter)
                    setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), toBePainted);
                else
                    paintEngine->d_func()->systemRect = q->data->crect;

                //paint the background
                if ((asRoot || q->autoFillBackground() || onScreen || q->testAttribute(Qt::WA_StyledBackground))
                    && !q->testAttribute(Qt::WA_OpaquePaintEvent) && !q->testAttribute(Qt::WA_NoSystemBackground)) {
                    beginBackingStorePainting();
                    QPainter p(q);
                    p.setRenderHint(QPainter::SmoothPixmapTransform);
                    paintBackground(&p, toBePainted, (asRoot || onScreen) ? (flags | DrawAsRoot) : DrawWidgetFlags());
                    endBackingStorePainting();
                }

                if (!sharedPainter)
                    setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), toBePainted.translated(offset));

                if (!onScreen && !asRoot && !isOpaque && q->testAttribute(Qt::WA_TintedBackground)) {
                    beginBackingStorePainting();
                    QPainter p(q);
                    QColor tint = q->palette().window().color();
                    tint.setAlphaF(.6f);
                    p.fillRect(toBePainted.boundingRect(), tint);
                    endBackingStorePainting();
                }
            }

#if 0
            qDebug() << "painting" << q << "opaque ==" << isOpaque();
            qDebug() << "clipping to" << toBePainted << "location == " << offset
                     << "geometry ==" << QRect(q->mapTo(q->window(), QPoint(0, 0)), q->size());
#endif

            bool skipPaintEvent = false;
            if (renderToTexture) {
                // This widget renders into a texture which is composed later. We just need to
                // punch a hole in the backingstore, so the texture will be visible.
                beginBackingStorePainting();
                if (!q->testAttribute(Qt::WA_AlwaysStackOnTop) && repaintManager) {
                    QPainter p(q);
                    p.setCompositionMode(QPainter::CompositionMode_Source);
                    p.fillRect(q->rect(), Qt::transparent);
                } else if (!repaintManager) {
                    // We are not drawing to a backingstore: fall back to QImage
                    QImage img = grabFramebuffer();
                    // grabFramebuffer() always sets the format to RGB32
                    // regardless of whether it is transparent or not.
                    if (img.format() == QImage::Format_RGB32)
                        img.reinterpretAsFormat(QImage::Format_ARGB32_Premultiplied);
                    QPainter p(q);
                    p.drawImage(q->rect(), img);
                    skipPaintEvent = true;
                }
                endBackingStorePainting();
                if (renderToTextureReallyDirty)
                    renderToTextureReallyDirty = 0;
                else
                    skipPaintEvent = true;
            }

            if (!skipPaintEvent) {
                //actually send the paint event
                sendPaintEvent(toBePainted);
            }

            if (repaintManager)
                repaintManager->markNeedsFlush(q, toBePainted, offset);

            //restore
            if (paintEngine) {
                restoreRedirected();
                if (!sharedPainter)
                    paintEngine->d_func()->systemRect = QRect();
                else
                    paintEngine->d_func()->currentClipDevice = nullptr;

                setSystemClip(pdev->paintEngine(), 1, QRegion());
            }
            q->setAttribute(Qt::WA_WState_InPaintEvent, false);
            if (Q_UNLIKELY(q->paintingActive()))
                qWarning("QWidget::repaint: It is dangerous to leave painters active on a widget outside of the PaintEvent");

            if (paintEngine && paintEngine->autoDestruct()) {
                delete paintEngine;
            }
        } else if (q->isWindow()) {
            QPaintEngine *engine = pdev->paintEngine();
            if (engine) {
                QPainter p(pdev);
                p.setClipRegion(toBePainted);
                const QBrush bg = q->palette().brush(QPalette::Window);
                if (bg.style() == Qt::TexturePattern)
                    p.drawTiledPixmap(q->rect(), bg.texture());
                else
                    p.fillRect(q->rect(), bg);

                if (engine->autoDestruct())
                    delete engine;
            }
        }
    }

    if (recursive && !children.isEmpty()) {
        paintSiblingsRecursive(pdev, children, children.size() - 1, rgn, offset, flags & ~DrawAsRoot,
                               sharedPainter, repaintManager);
    }
}